

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

void __thiscall
TTD::SnapshotExtractor::MarkVisitStandardProperties(SnapshotExtractor *this,RecyclableObject *obj)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  DynamicObject *this_00;
  ArrayObject *var;
  
  bVar2 = Js::DynamicType::Is(((obj->type).ptr)->typeId);
  if (!bVar2) {
    iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[10])(obj);
    if (iVar3 != 0) {
      TTDAbort_unrecoverable_error("Only dynamic objects should have standard properties.");
    }
  }
  bVar2 = Js::DynamicType::Is(((obj->type).ptr)->typeId);
  if (bVar2) {
    this_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    plVar1 = *(long **)((this_00->super_RecyclableObject).type.ptr + 1);
    (**(code **)(*plVar1 + 800))(plVar1,this,this_00);
    var = Js::DynamicObject::GetObjectArray(this_00);
    if (var != (ArrayObject *)0x0) {
      MarkVisitVar(this,var);
      return;
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitStandardProperties(Js::RecyclableObject* obj)
    {
        TTDAssert(Js::DynamicType::Is(obj->GetTypeId()) || obj->GetPropertyCount() == 0, "Only dynamic objects should have standard properties.");

        if(Js::DynamicType::Is(obj->GetTypeId()))
        {
            Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(obj);

            dynObj->GetDynamicType()->GetTypeHandler()->MarkObjectSlots_TTD(this, dynObj);

            Js::ArrayObject* parray = dynObj->GetObjectArray();
            if(parray != nullptr)
            {
                this->MarkVisitVar(parray);
            }
        }
    }